

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_secret_with_hash(ptls_key_schedule_t *sched,void *secret,char *label,uint8_t *hash)

{
  ptls_hash_algorithm_t *algo;
  size_t outlen;
  int iVar1;
  ptls_iovec_t secret_00;
  ptls_iovec_t hash_value;
  int ret;
  uint8_t *hash_local;
  char *label_local;
  void *secret_local;
  ptls_key_schedule_t *sched_local;
  
  algo = sched->hashes[0].algo;
  outlen = (sched->hashes[0].algo)->digest_size;
  secret_00 = ptls_iovec_init(sched->secret,(sched->hashes[0].algo)->digest_size);
  hash_value = ptls_iovec_init(hash,(sched->hashes[0].algo)->digest_size);
  iVar1 = ptls_hkdf_expand_label(algo,secret,outlen,secret_00,label,hash_value,(char *)0x0);
  return iVar1;
}

Assistant:

static int derive_secret_with_hash(ptls_key_schedule_t *sched, void *secret, const char *label, const uint8_t *hash)
{
    int ret = ptls_hkdf_expand_label(sched->hashes[0].algo, secret, sched->hashes[0].algo->digest_size,
                                     ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), label,
                                     ptls_iovec_init(hash, sched->hashes[0].algo->digest_size), NULL);
    PTLS_DEBUGF("%s: (label=%s, hash=%02x%02x) => %02x%02x\n", __FUNCTION__, label, hash[0], hash[1], ((uint8_t *)secret)[0],
                ((uint8_t *)secret)[1]);
    return ret;
}